

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint16 drwav_fmt_get_format(drwav_fmt *pFMT)

{
  drwav_fmt *pFMT_local;
  drwav_uint16 local_a;
  
  if (pFMT == (drwav_fmt *)0x0) {
    local_a = 0;
  }
  else if (pFMT->formatTag == 0xfffe) {
    local_a = *(drwav_uint16 *)pFMT->subFormat;
  }
  else {
    local_a = pFMT->formatTag;
  }
  return local_a;
}

Assistant:

DRWAV_API drwav_uint16 drwav_fmt_get_format(const drwav_fmt* pFMT)
{
    if (pFMT == NULL) {
        return 0;
    }

    if (pFMT->formatTag != DR_WAVE_FORMAT_EXTENSIBLE) {
        return pFMT->formatTag;
    } else {
        return drwav__bytes_to_u16(pFMT->subFormat);    /* Only the first two bytes are required. */
    }
}